

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::minEigenVector<Imath_3_2::Matrix33<float>,Imath_3_2::Vec3<float>>
               (Matrix33<float> *A,Vec3<float> *V)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  Vec3<float> *in_RSI;
  Vec3<float> *pVVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  uint i_1;
  uint i;
  int minIdx;
  Matrix33<float> MV;
  Vec3<float> S;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffbc;
  uint i_00;
  Matrix33<float> *in_stack_ffffffffffffffc0;
  Vec3<float> local_1c;
  Vec3<float> *local_10;
  
  local_10 = in_RSI;
  Vec3<float>::Vec3(&local_1c);
  Matrix33<float>::Matrix33((Matrix33<float> *)&stack0xffffffffffffffc0);
  jacobiEigenSolver<float>
            (in_stack_ffffffffffffffc0,
             (Vec3<float> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  i_00 = 0;
  uVar6 = 1;
  while( true ) {
    uVar5 = uVar6;
    uVar2 = Vec3<float>::dimensions();
    if (uVar2 <= uVar6) break;
    pVVar4 = &local_1c;
    Vec3<float>::operator[](pVVar4,uVar5);
    std::abs((int)pVVar4);
    pVVar4 = &local_1c;
    Vec3<float>::operator[](pVVar4,i_00);
    std::abs((int)pVVar4);
    if (extraout_XMM0_Da < extraout_XMM0_Da_00) {
      i_00 = uVar5;
    }
    uVar6 = uVar5 + 1;
  }
  uVar6 = 0;
  while( true ) {
    uVar5 = uVar6;
    uVar2 = Vec3<float>::dimensions();
    if (uVar2 <= uVar6) break;
    pfVar3 = Matrix33<float>::operator[]((Matrix33<float> *)&stack0xffffffffffffffc0,uVar5);
    fVar1 = pfVar3[(int)i_00];
    pfVar3 = Vec3<float>::operator[](local_10,uVar5);
    *pfVar3 = fVar1;
    uVar6 = uVar5 + 1;
  }
  return;
}

Assistant:

void
minEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver (A, S, MV);

    int minIdx (0);
    for (unsigned int i = 1; i < TV::dimensions (); ++i)
    {
        if (std::abs (S[i]) < std::abs (S[minIdx])) minIdx = i;
    }

    for (unsigned int i = 0; i < TV::dimensions (); ++i)
        V[i] = MV[i][minIdx];
}